

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

void MultRow_SSE2(uint8_t *ptr,uint8_t *alpha,int width,int inverse)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar4 [16];
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i a1;
  __m128i v1;
  __m128i a0;
  __m128i v0;
  __m128i kMult;
  __m128i k128;
  __m128i zero;
  int x;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  char in_stack_fffffffffffffdb8;
  char in_stack_fffffffffffffdb9;
  char in_stack_fffffffffffffdba;
  char in_stack_fffffffffffffdbb;
  char in_stack_fffffffffffffdbc;
  char in_stack_fffffffffffffdbd;
  char in_stack_fffffffffffffdbe;
  char in_stack_fffffffffffffdbf;
  undefined1 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc1;
  undefined1 in_stack_fffffffffffffdc2;
  undefined1 in_stack_fffffffffffffdc3;
  undefined1 in_stack_fffffffffffffdc4;
  undefined1 in_stack_fffffffffffffdc5;
  undefined1 in_stack_fffffffffffffdc6;
  undefined1 in_stack_fffffffffffffdc7;
  undefined4 local_194;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 local_28;
  undefined2 uStack_26;
  undefined2 uStack_24;
  undefined2 uStack_22;
  undefined2 uStack_20;
  undefined2 uStack_1e;
  undefined2 uStack_1c;
  undefined2 uStack_1a;
  
  local_194 = 0;
  if (in_ECX == 0) {
    in_stack_fffffffffffffdb4 = 0x1010080;
    for (local_194 = 0; local_194 + 8 <= in_EDX; local_194 = local_194 + 8) {
      uVar1 = *(undefined8 *)(in_RDI + local_194);
      uVar2 = *(undefined8 *)(in_RSI + local_194);
      local_a8 = (byte)uVar1;
      uStack_a7 = (byte)((ulong)uVar1 >> 8);
      uStack_a6 = (byte)((ulong)uVar1 >> 0x10);
      uStack_a5 = (byte)((ulong)uVar1 >> 0x18);
      uStack_a4 = (byte)((ulong)uVar1 >> 0x20);
      uStack_a3 = (byte)((ulong)uVar1 >> 0x28);
      uStack_a2 = (byte)((ulong)uVar1 >> 0x30);
      uStack_a1 = (byte)((ulong)uVar1 >> 0x38);
      local_c8 = (byte)uVar2;
      uStack_c7 = (byte)((ulong)uVar2 >> 8);
      uStack_c6 = (byte)((ulong)uVar2 >> 0x10);
      uStack_c5 = (byte)((ulong)uVar2 >> 0x18);
      uStack_c4 = (byte)((ulong)uVar2 >> 0x20);
      uStack_c3 = (byte)((ulong)uVar2 >> 0x28);
      uStack_c2 = (byte)((ulong)uVar2 >> 0x30);
      uStack_c1 = (byte)((ulong)uVar2 >> 0x38);
      uStack_86 = (ushort)uStack_a7;
      uStack_84 = (ushort)uStack_a6;
      uStack_82 = (ushort)uStack_a5;
      uStack_7e = (ushort)uStack_a3;
      uStack_7c = (ushort)uStack_a2;
      uStack_7a = (ushort)uStack_a1;
      uStack_96 = (ushort)uStack_c7;
      uStack_94 = (ushort)uStack_c6;
      uStack_92 = (ushort)uStack_c5;
      uStack_8e = (ushort)uStack_c3;
      uStack_8c = (ushort)uStack_c2;
      uStack_8a = (ushort)uStack_c1;
      auVar3._2_2_ = uStack_86 * uStack_96 + 0x80;
      auVar3._0_2_ = (ushort)local_a8 * (ushort)local_c8 + 0x80;
      auVar3._4_2_ = uStack_84 * uStack_94 + 0x80;
      auVar3._6_2_ = uStack_82 * uStack_92 + 0x80;
      auVar3._10_2_ = uStack_7e * uStack_8e + 0x80;
      auVar3._8_2_ = (ushort)uStack_a4 * (ushort)uStack_c4 + 0x80;
      auVar3._12_2_ = uStack_7c * uStack_8c + 0x80;
      auVar3._14_2_ = uStack_7a * uStack_8a + 0x80;
      auVar4._8_8_ = 0x101010101010101;
      auVar4._0_8_ = 0x101010101010101;
      auVar4 = pmulhuw(auVar3,auVar4);
      local_28 = auVar4._0_2_;
      uStack_26 = auVar4._2_2_;
      uStack_24 = auVar4._4_2_;
      uStack_22 = auVar4._6_2_;
      uStack_20 = auVar4._8_2_;
      uStack_1e = auVar4._10_2_;
      uStack_1c = auVar4._12_2_;
      uStack_1a = auVar4._14_2_;
      in_stack_fffffffffffffdb8 =
           (0 < local_28) * (local_28 < 0x100) * auVar4[0] - (0xff < local_28);
      in_stack_fffffffffffffdb9 =
           (0 < uStack_26) * (uStack_26 < 0x100) * auVar4[2] - (0xff < uStack_26);
      in_stack_fffffffffffffdba =
           (0 < uStack_24) * (uStack_24 < 0x100) * auVar4[4] - (0xff < uStack_24);
      in_stack_fffffffffffffdbb =
           (0 < uStack_22) * (uStack_22 < 0x100) * auVar4[6] - (0xff < uStack_22);
      in_stack_fffffffffffffdbc =
           (0 < uStack_20) * (uStack_20 < 0x100) * auVar4[8] - (0xff < uStack_20);
      in_stack_fffffffffffffdbd =
           (0 < uStack_1e) * (uStack_1e < 0x100) * auVar4[10] - (0xff < uStack_1e);
      in_stack_fffffffffffffdbe =
           (0 < uStack_1c) * (uStack_1c < 0x100) * auVar4[0xc] - (0xff < uStack_1c);
      in_stack_fffffffffffffdbf =
           (0 < uStack_1a) * (uStack_1a < 0x100) * auVar4[0xe] - (0xff < uStack_1a);
      in_stack_fffffffffffffdc0 = 0;
      in_stack_fffffffffffffdc1 = 0;
      in_stack_fffffffffffffdc2 = 0;
      in_stack_fffffffffffffdc3 = 0;
      in_stack_fffffffffffffdc4 = 0;
      in_stack_fffffffffffffdc5 = 0;
      in_stack_fffffffffffffdc6 = 0;
      in_stack_fffffffffffffdc7 = 0;
      *(ulong *)(in_RDI + local_194) =
           CONCAT17(in_stack_fffffffffffffdbf,
                    CONCAT16(in_stack_fffffffffffffdbe,
                             CONCAT15(in_stack_fffffffffffffdbd,
                                      CONCAT14(in_stack_fffffffffffffdbc,
                                               CONCAT13(in_stack_fffffffffffffdbb,
                                                        CONCAT12(in_stack_fffffffffffffdba,
                                                                 CONCAT11(in_stack_fffffffffffffdb9,
                                                                          in_stack_fffffffffffffdb8)
                                                                ))))));
    }
  }
  if (0 < in_EDX - local_194) {
    WebPMultRow_C((uint8_t *)
                  CONCAT17(in_stack_fffffffffffffdc7,
                           CONCAT16(in_stack_fffffffffffffdc6,
                                    CONCAT15(in_stack_fffffffffffffdc5,
                                             CONCAT14(in_stack_fffffffffffffdc4,
                                                      CONCAT13(in_stack_fffffffffffffdc3,
                                                               CONCAT12(in_stack_fffffffffffffdc2,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffdc1,
                                                  in_stack_fffffffffffffdc0))))))),
                  (uint8_t *)
                  CONCAT17(in_stack_fffffffffffffdbf,
                           CONCAT16(in_stack_fffffffffffffdbe,
                                    CONCAT15(in_stack_fffffffffffffdbd,
                                             CONCAT14(in_stack_fffffffffffffdbc,
                                                      CONCAT13(in_stack_fffffffffffffdbb,
                                                               CONCAT12(in_stack_fffffffffffffdba,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffdb9,
                                                  in_stack_fffffffffffffdb8))))))),
                  in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0);
  }
  return;
}

Assistant:

static void MultRow_SSE2(uint8_t* WEBP_RESTRICT const ptr,
                         const uint8_t* WEBP_RESTRICT const alpha,
                         int width, int inverse) {
  int x = 0;
  if (!inverse) {
    const __m128i zero = _mm_setzero_si128();
    const __m128i k128 = _mm_set1_epi16(128);
    const __m128i kMult = _mm_set1_epi16(0x0101);
    for (x = 0; x + 8 <= width; x += 8) {
      const __m128i v0 = _mm_loadl_epi64((__m128i*)&ptr[x]);
      const __m128i a0 = _mm_loadl_epi64((const __m128i*)&alpha[x]);
      const __m128i v1 = _mm_unpacklo_epi8(v0, zero);
      const __m128i a1 = _mm_unpacklo_epi8(a0, zero);
      const __m128i v2 = _mm_mullo_epi16(v1, a1);
      const __m128i v3 = _mm_add_epi16(v2, k128);
      const __m128i v4 = _mm_mulhi_epu16(v3, kMult);
      const __m128i v5 = _mm_packus_epi16(v4, zero);
      _mm_storel_epi64((__m128i*)&ptr[x], v5);
    }
  }
  width -= x;
  if (width > 0) WebPMultRow_C(ptr + x, alpha + x, width, inverse);
}